

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall Assimp::Collada::Node::~Node(Node *this)

{
  Node *this_00;
  pointer ppNVar1;
  
  for (ppNVar1 = (this->mChildren).
                 super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppNVar1 !=
      (this->mChildren).
      super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar1 = ppNVar1 + 1) {
    this_00 = *ppNVar1;
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
    }
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->mPrimaryCamera);
  std::vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>::
  ~vector(&this->mNodeInstances);
  std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>::
  ~vector(&this->mCameras);
  std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>::
  ~vector(&this->mLights);
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  ~vector(&this->mMeshes);
  std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::~vector
            (&this->mTransforms);
  std::_Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
  ~_Vector_base(&(this->mChildren).
                 super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
               );
  std::__cxx11::string::~string((string *)&this->mSID);
  std::__cxx11::string::~string((string *)&this->mID);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Node() {
        for( std::vector<Node*>::iterator it = mChildren.begin(); it != mChildren.end(); ++it)
            delete *it;
    }